

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

double NEST::NESTcalc::interpolateFunction
                 (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  *func,double x,bool isLogLog)

{
  pointer ppVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  undefined8 uVar8;
  double *pdVar9;
  undefined3 in_register_00000031;
  ulong uVar10;
  long lVar11;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  double y_desired;
  undefined1 local_58 [16];
  
  local_58._12_4_ = in_XMM0_Dd;
  local_58._8_4_ = in_XMM0_Dc;
  uVar8 = local_58._8_8_;
  if (CONCAT31(in_register_00000031,isLogLog) == 0) {
    ppVar1 = (func->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)(func->
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4;
    pdVar9 = &ppVar1[1].second;
    local_58 = ZEXT816(0);
    do {
      lVar11 = lVar11 + -1;
      if (lVar11 == 0) {
        return (double)local_58._0_8_;
      }
      dVar2 = pdVar9[-3];
      dVar3 = ((pair<double,_double> *)(pdVar9 + -1))->first;
      if (dVar3 >= x && x > dVar2) {
        local_58._0_8_ = (x - dVar2) * ((*pdVar9 - pdVar9[-2]) / (dVar3 - dVar2)) + pdVar9[-2];
        local_58 = CONCAT88(uVar8,local_58._0_8_);
      }
      pdVar9 = pdVar9 + 2;
    } while (dVar3 < x || x <= dVar2);
  }
  else {
    local_58 = ZEXT816(0);
    uVar10 = 0xffffffffffffffff;
    lVar11 = 0;
    do {
      ppVar1 = (func->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar10 + 1;
      if (((long)(func->
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) - 1U <= uVar10) {
        return (double)local_58._0_8_;
      }
      dVar2 = log10(*(double *)((long)&ppVar1->first + lVar11));
      dVar3 = log10(*(double *)
                     ((long)&(func->
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1].first + lVar11));
      dVar4 = log10(x);
      bVar7 = true;
      if ((dVar2 < dVar4) && (dVar4 = log10(x), dVar4 < dVar3)) {
        dVar4 = log10(*(double *)
                       ((long)&((func->
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->second + lVar11));
        dVar5 = log10(*(double *)
                       ((long)&(func->
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[1].second + lVar11));
        dVar6 = log10(x);
        dVar2 = pow(10.0,((dVar5 - dVar4) / (dVar3 - dVar2)) * (dVar6 - dVar2) + dVar4);
        local_58._8_4_ = extraout_XMM0_Dc;
        local_58._0_8_ = dVar2;
        local_58._12_4_ = extraout_XMM0_Dd;
        bVar7 = false;
      }
      lVar11 = lVar11 + 0x10;
    } while (bVar7);
  }
  return (double)local_58._0_8_;
}

Assistant:

double NESTcalc::interpolateFunction(
    const std::vector<std::pair<double, double> > &func, double x,
    bool isLogLog) {
  // Linear interpolation
  if (!isLogLog) {
    double y_desired = 0;
    for (int iP = 0; iP < func.size() - 1; ++iP) {
      double x1 = func[iP].first;
      double x2 = func[iP + 1].first;
      if (x1 < x && x2 >= x) {
        double y1 = func[iP].second;
        double y2 = func[iP + 1].second;
        double slope = (y2 - y1) / (x2 - x1);
        y_desired = y1 + (slope * (x - x1));
        break;
      }
    }
    return y_desired;
  }

  // Linear interpolation on a log-log scale (more accurate at high fields,
  // where points are far apart on a linear scale)
  else {
    double y_desired = 0;
    for (int iP = 0; iP < func.size() - 1; ++iP) {
      double logx1 = log10(func[iP].first);
      double logx2 = log10(func[iP + 1].first);
      if (logx1 < log10(x) && logx2 > log10(x)) {
        double logy1 = log10(func[iP].second);
        double logy2 = log10(func[iP + 1].second);
        double slope = (logy2 - logy1) / (logx2 - logx1);
        double logy_desired = logy1 + slope * (log10(x) - logx1);
        y_desired = pow(10, logy_desired);
        break;
      }
    }
    return y_desired;
  }
}